

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::getCenterOfMassProjectConstraintConvexHull
          (InverseKinematics *this,Polygon2D *poly)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return false;
}

Assistant:

bool InverseKinematics::getCenterOfMassProjectConstraintConvexHull(Polygon2D& poly)
    {
#ifdef IDYNTREE_USES_IPOPT
        if (!IK_PIMPL(m_pimpl)->m_comHullConstraint.isActive())
        {
            poly.setNrOfVertices(0);
            return false;
        }

        if (!IK_PIMPL(m_pimpl)->m_problemInitialized) {
            IK_PIMPL(m_pimpl)->computeProblemSizeAndResizeBuffers();
        }

        poly = IK_PIMPL(m_pimpl)->m_comHullConstraint.projectedConvexHull;
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }